

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

bool google::protobuf::Base64UnescapeInternal(char *src,int slen,string *dest,char *unbase64)

{
  uint uVar1;
  ulong uVar2;
  pointer pcVar3;
  int iVar4;
  
  iVar4 = slen + 3;
  if (-1 < slen) {
    iVar4 = slen;
  }
  iVar4 = slen - (iVar4 >> 2);
  pcVar3 = (char *)0x0;
  std::__cxx11::string::resize((ulong)dest,(char)iVar4);
  if (dest->_M_string_length != 0) {
    pcVar3 = (dest->_M_dataplus)._M_p;
  }
  uVar1 = Base64UnescapeInternal(src,slen,pcVar3,iVar4,unbase64);
  if ((int)uVar1 < 0) {
    dest->_M_string_length = 0;
    pcVar3 = (dest->_M_dataplus)._M_p;
  }
  else {
    uVar2 = (ulong)uVar1;
    if (dest->_M_string_length < uVar2) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
    }
    dest->_M_string_length = uVar2;
    pcVar3 = (dest->_M_dataplus)._M_p + uVar2;
  }
  *pcVar3 = '\0';
  return -1 < (int)uVar1;
}

Assistant:

static bool Base64UnescapeInternal(const char* src, int slen, string* dest,
                                   const signed char* unbase64) {
  // Determine the size of the output string.  Base64 encodes every 3 bytes into
  // 4 characters.  any leftover chars are added directly for good measure.
  // This is documented in the base64 RFC: http://tools.ietf.org/html/rfc3548
  const int dest_len = 3 * (slen / 4) + (slen % 4);

  dest->resize(dest_len);

  // We are getting the destination buffer by getting the beginning of the
  // string and converting it into a char *.
  const int len = Base64UnescapeInternal(src, slen, string_as_array(dest),
                                         dest_len, unbase64);
  if (len < 0) {
    dest->clear();
    return false;
  }

  // could be shorter if there was padding
  GOOGLE_DCHECK_LE(len, dest_len);
  dest->erase(len);

  return true;
}